

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O3

void __thiscall
libcellml::Annotator::AnnotatorImpl::addIssueInvalidArgument
          (AnnotatorImpl *this,CellmlElementType type)

{
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  IssuePtr issue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> description;
  CellmlElementType in_stack_ffffffffffffff6c;
  IssuePtr local_90;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  Issue::IssueImpl::create();
  cellmlElementTypeAsString_abi_cxx11_(in_stack_ffffffffffffff6c);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x29029d);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_50 = *plVar2;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar2;
    local_60 = (long *)*plVar1;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_60);
  psVar3 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_80.field_2._M_allocated_capacity = *psVar3;
    local_80.field_2._8_8_ = plVar1[3];
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar3;
    local_80._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_80._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  Issue::IssueImpl::setDescription
            ((local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl,&local_80);
  Issue::IssueImpl::setReferenceRule
            ((local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl,ANNOTATOR_INCONSISTENT_TYPE);
  Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return;
}

Assistant:

void Annotator::AnnotatorImpl::addIssueInvalidArgument(CellmlElementType type)
{
    auto issue = Issue::IssueImpl::create();
    auto description = "The item is internally inconsistent: the enum type '" + cellmlElementTypeAsString(type) + "' cannot be used with the stored item.";
    issue->mPimpl->setDescription(description);
    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ANNOTATOR_INCONSISTENT_TYPE);
    addIssue(issue);
}